

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O3

void read_bytes_size_t<_IO_FILE*>
               (void *ptr,size_t n_els,_IO_FILE **in,PlatformSize saved_size_t,
               bool has_same_endianness)

{
  runtime_error *this;
  vector<char,_std::allocator<char>_> buffer;
  vector<char,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (saved_size_t == Is64Bit) {
    read_bytes<unsigned_long>(ptr,n_els,in);
    if (!has_same_endianness) {
      swap_endianness<unsigned_long>((unsigned_long *)ptr,n_els);
      return;
    }
  }
  else {
    if (saved_size_t != Is32Bit) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_150,"Unexpected error in ","");
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/david-cortes[P]isotree/src/serialize.cpp"
                 ,"");
      std::operator+(&local_b0,&local_150,&local_f0);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,":","");
      std::operator+(&local_90,&local_b0,&local_110);
      std::__cxx11::to_string(&local_d0,0xb53);
      std::operator+(&local_70,&local_90,&local_d0);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,
                 ". Please open an issue in GitHub with this information, indicating the installed version of \'isotree\'.\n"
                 ,"");
      std::operator+(&local_50,&local_70,&local_130);
      std::runtime_error::runtime_error(this,(string *)&local_50);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    read_bytes<unsigned_long,unsigned_int>(ptr,n_els,in,&local_168,!has_same_endianness);
    if (local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void read_bytes_size_t(void *ptr, const size_t n_els, itype &in, const PlatformSize saved_size_t, const bool has_same_endianness)
{
    std::vector<char> buffer;
    switch(saved_size_t)
    {
        case Is32Bit:
        {
            read_bytes<size_t, uint32_t>(ptr, n_els, in, buffer, !has_same_endianness);
            break;
        }

        case Is64Bit:
        {
            read_bytes<size_t, uint64_t>(ptr, n_els, in, buffer, !has_same_endianness);
            break;
        }

        default:
        {
            unexpected_error();
        }
    }
}